

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O1

int secp256k1_rangeproof_genrand
              (secp256k1_scalar *sec,secp256k1_scalar *s,uchar *message,size_t *rsizes,size_t rings,
              uchar *nonce,secp256k1_ge *commit,uchar *proof,size_t len,secp256k1_ge *genp)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  byte bVar4;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  size_t sVar5;
  uint uVar6;
  secp256k1_scalar *psVar7;
  uchar *puVar8;
  long lVar9;
  ulong uVar10;
  secp256k1_scalar acc;
  secp256k1_rfc6979_hmac_sha256 rng;
  uchar tmp [32];
  uchar rngseed [108];
  int local_18c;
  uchar *local_188;
  uchar *local_180;
  size_t *local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  secp256k1_scalar *local_158;
  secp256k1_scalar *local_150;
  secp256k1_scalar local_148;
  secp256k1_rfc6979_hmac_sha256 local_128;
  secp256k1_fe local_d8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  byte local_88;
  uchar local_87 [32];
  byte local_67;
  uchar local_66 [32];
  undefined1 local_46 [22];
  
  local_a8 = *(undefined8 *)nonce;
  uStack_a0 = *(undefined8 *)(nonce + 8);
  local_98 = *(undefined8 *)(nonce + 0x10);
  uStack_90 = *(undefined8 *)(nonce + 0x18);
  local_d8.n[4] = (commit->x).n[4];
  local_d8.n[0] = (commit->x).n[0];
  local_d8.n[1] = (commit->x).n[1];
  local_d8.n[2] = (commit->x).n[2];
  local_d8.n[3] = (commit->x).n[3];
  local_180 = message;
  local_178 = rsizes;
  local_158 = sec;
  local_150 = s;
  secp256k1_fe_normalize(&local_d8);
  iVar1 = secp256k1_fe_sqrt((secp256k1_fe *)&local_128,&commit->y);
  local_88 = (byte)iVar1 ^ 1;
  secp256k1_fe_get_b32(local_87,&local_d8);
  local_d8.n[4] = (genp->x).n[4];
  local_d8.n[0] = (genp->x).n[0];
  local_d8.n[1] = (genp->x).n[1];
  local_d8.n[2] = (genp->x).n[2];
  local_d8.n[3] = (genp->x).n[3];
  secp256k1_fe_normalize(&local_d8);
  iVar1 = secp256k1_fe_sqrt((secp256k1_fe *)&local_128,&genp->y);
  local_67 = (byte)iVar1 ^ 1;
  secp256k1_fe_get_b32(local_66,&local_d8);
  memcpy(local_46,proof,len);
  secp256k1_rfc6979_hmac_sha256_initialize(&local_128,(uchar *)&local_a8,len + 0x62);
  local_148.d[2] = 0;
  local_148.d[3] = 0;
  local_148.d[0] = 0;
  local_148.d[1] = 0;
  if (rings == 0) {
    uVar6 = 1;
  }
  else {
    local_168 = rings - 1;
    uVar6 = 1;
    lVar9 = 0;
    local_188 = local_180;
    local_170 = 0;
    sVar5 = extraout_RDX;
    local_160 = rings;
    do {
      psVar7 = local_158 + local_170;
      if (local_170 < local_168) {
        secp256k1_rfc6979_hmac_sha256_generate(&local_128,(uchar *)&local_d8,sVar5);
        sVar5 = extraout_RDX_00;
        do {
          do {
            secp256k1_rfc6979_hmac_sha256_generate(&local_128,(uchar *)&local_d8,sVar5);
            secp256k1_scalar_set_b32(psVar7,(uchar *)&local_d8,&local_18c);
            sVar5 = extraout_RDX_01;
          } while (local_18c != 0);
        } while (((psVar7->d[1] == 0 && psVar7->d[0] == 0) && psVar7->d[2] == 0) &&
                 psVar7->d[3] == 0);
        secp256k1_scalar_add(&local_148,&local_148,psVar7);
        sVar5 = extraout_RDX_02;
      }
      else {
        secp256k1_scalar_negate(&local_148,&local_148);
        psVar7->d[2] = local_148.d[2];
        psVar7->d[3] = local_148.d[3];
        psVar7->d[0] = local_148.d[0];
        psVar7->d[1] = local_148.d[1];
        sVar5 = extraout_RDX_03;
      }
      if (local_178[local_170] != 0) {
        uVar10 = 0;
        puVar8 = local_188;
        do {
          secp256k1_rfc6979_hmac_sha256_generate(&local_128,(uchar *)&local_d8,sVar5);
          if (local_180 != (uchar *)0x0) {
            lVar3 = 0;
            do {
              bVar4 = *(byte *)((long)local_d8.n + lVar3) ^ puVar8[lVar3];
              *(byte *)((long)local_d8.n + lVar3) = bVar4;
              puVar8[lVar3] = bVar4;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 0x20);
          }
          psVar7 = local_150 + lVar9;
          secp256k1_scalar_set_b32(psVar7,(uchar *)&local_d8,&local_18c);
          uVar2 = 0;
          if (local_18c == 0) {
            uVar2 = (uint)(((psVar7->d[1] != 0 || psVar7->d[0] != 0) || psVar7->d[2] != 0) ||
                          psVar7->d[3] != 0);
          }
          uVar6 = uVar6 & uVar2;
          lVar9 = lVar9 + 1;
          uVar10 = uVar10 + 1;
          puVar8 = puVar8 + 0x20;
          sVar5 = extraout_RDX_04;
        } while (uVar10 < local_178[local_170]);
      }
      local_170 = local_170 + 1;
      local_188 = local_188 + 0x80;
    } while (local_170 != local_160);
  }
  return uVar6;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_genrand(secp256k1_scalar *sec, secp256k1_scalar *s, unsigned char *message,
 size_t *rsizes, size_t rings, const unsigned char *nonce, const secp256k1_ge *commit, const unsigned char *proof, size_t len, const secp256k1_ge* genp) {
    unsigned char tmp[32];
    unsigned char rngseed[32 + 33 + 33 + 10];
    secp256k1_rfc6979_hmac_sha256 rng;
    secp256k1_scalar acc;
    int overflow;
    int ret;
    size_t i;
    size_t j;
    int b;
    size_t npub;
    VERIFY_CHECK(len <= 10);
    memcpy(rngseed, nonce, 32);
    secp256k1_rangeproof_serialize_point(rngseed + 32, commit);
    secp256k1_rangeproof_serialize_point(rngseed + 32 + 33, genp);
    memcpy(rngseed + 33 + 33 + 32, proof, len);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, rngseed, 32 + 33 + 33 + len);
    secp256k1_scalar_clear(&acc);
    npub = 0;
    ret = 1;
    for (i = 0; i < rings; i++) {
        if (i < rings - 1) {
            secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
            do {
                secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
                secp256k1_scalar_set_b32(&sec[i], tmp, &overflow);
            } while (overflow || secp256k1_scalar_is_zero(&sec[i]));
            secp256k1_scalar_add(&acc, &acc, &sec[i]);
        } else {
            secp256k1_scalar_negate(&acc, &acc);
            sec[i] = acc;
        }
        for (j = 0; j < rsizes[i]; j++) {
            secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
            if (message) {
                for (b = 0; b < 32; b++) {
                    tmp[b] ^= message[(i * 4 + j) * 32 + b];
                    message[(i * 4 + j) * 32 + b] = tmp[b];
                }
            }
            secp256k1_scalar_set_b32(&s[npub], tmp, &overflow);
            ret &= !(overflow || secp256k1_scalar_is_zero(&s[npub]));
            npub++;
        }
    }
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    secp256k1_scalar_clear(&acc);
    memset(tmp, 0, 32);
    return ret;
}